

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

uint sum<unsigned_int>(vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                       *tensor)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  double dVar4;
  undefined4 local_1c;
  undefined4 local_18;
  int j;
  int i;
  uint result;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *tensor_local;
  
  j = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            ::size(tensor);
    if (sVar1 <= (ulong)(long)local_18) break;
    local_1c = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](tensor,(long)local_18);
      sVar1 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_1c) break;
      pvVar2 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](tensor,(long)local_18);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar2,(long)local_1c);
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
      pvVar2 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](tensor,(long)local_18);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar2,(long)local_1c);
      __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
      dVar4 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )__first._M_current,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )__last._M_current,0.0);
      j = (int)(long)((double)(uint)j + dVar4);
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  }
  return j;
}

Assistant:

T sum(std::vector<std::vector<std::vector<T> > > tensor){
    T result(0);
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            result += accumulate(tensor[i][j].begin(), tensor[i][j].end(), 0.0);
        }
    }
    return result;
}